

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::SampleStencilCase::iterate(SampleStencilCase *this)

{
  ostringstream *poVar1;
  int width;
  uint uVar2;
  TestLog *log;
  bool bVar3;
  GLenum GVar4;
  ostream *poVar5;
  Surface *pSVar6;
  void *__buf;
  void *__buf_00;
  char *description;
  void *__buf_01;
  long lVar7;
  ulong uVar8;
  int i;
  int iVar9;
  float fVar10;
  Surface clearedImg;
  Surface renderedImgSecond;
  Surface renderedImgFirst;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  float local_254;
  undefined1 local_250 [8];
  float local_248;
  undefined4 uStack_244;
  float local_238;
  Vec2 local_220;
  Vec2 local_218;
  Vec2 local_210;
  Surface local_208;
  Surface local_1f0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  float local_58;
  float local_48;
  
  log = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_1f0,iVar9,iVar9);
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_208,iVar9,iVar9);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d4);
  glwClearStencil(0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearStencil(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d5);
  glwClear(0x4400);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d6);
  glwEnable(0xb90);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glEnable(GL_STENCIL_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d7);
  glwStencilFunc(0x207,1,1);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilFunc(GL_ALWAYS, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d8);
  glwStencilOp(0x1e00,0x1e00,0x1e01);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3d9);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)"
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  iVar9 = 0;
  do {
    local_238 = ((float)iVar9 * 6.2831855) / 25.0;
    local_254 = (((float)iVar9 + 0.5) * 6.2831855) / 25.0;
    local_48 = cosf(local_238);
    local_58 = sinf(local_238);
    local_238 = cosf(local_254);
    fVar10 = sinf(local_254);
    local_1d8._0_8_ = (TestLog *)0x3f8000003f800000;
    local_1d8._8_8_ = 0x3f8000003f800000;
    local_298._0_8_ = (pointer)0x0;
    local_298._8_4_ = 0.0;
    local_278._0_8_ = CONCAT44(local_58 * (float)0x3f733333,local_48 * (float)0x3f733333);
    local_278._8_4_ = 0.0;
    local_250 = (undefined1  [8])CONCAT44(fVar10 * (float)0x3f733333,local_238 * (float)0x3f733333);
    local_248 = 0.0;
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,(Vec3 *)local_298,(Vec3 *)local_278,(Vec3 *)local_250,
               (Vec4 *)local_1d8,(Vec4 *)local_1d8,(Vec4 *)local_1d8);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0x19);
  MultisampleCase::readImage(&this->super_MultisampleCase,&local_1f0);
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"RenderedImgFirst","");
  local_278._0_8_ = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"First image rendered","");
  pSVar6 = &local_1f0;
  tcu::LogImage::LogImage
            ((LogImage *)local_1d8,(string *)local_298,(string *)local_278,pSVar6,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  iVar9 = (int)log;
  tcu::LogImage::write((LogImage *)local_1d8,iVar9,__buf,(size_t)pSVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1d8._0_8_ != (TestLog *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ != &local_268) {
    operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Clearing color buffer to black",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  glwClear(0x4000);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3f0);
  glwStencilFunc(0x202,1,1);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilFunc(GL_EQUAL, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3f1);
  glwStencilOp(0x1e00,0x1e00,0x1e00);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x3f2);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Checking that color buffer was actually cleared to black",0x38);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  width = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_250,width,width);
  MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)local_250);
  if (0 < (int)local_250._4_4_) {
    lVar7 = 0;
    fVar10 = 0.0;
    do {
      if (0 < (int)local_250._0_4_) {
        uVar8 = 0;
        do {
          uVar2 = *(uint *)(CONCAT44(uStack_244,local_248) + (long)((int)lVar7 + (int)uVar8) * 4);
          if (uVar2 != 0xff000000) {
            poVar1 = (ostringstream *)(local_1d8 + 8);
            local_1d8._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Failure: first non-black pixel, color ",0x26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
            poVar5 = (ostream *)std::ostream::operator<<(poVar1,uVar2 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", detected at coordinates (",0x1b);
            std::ostream::operator<<(poVar1,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(int)fVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_160);
            local_298._0_8_ = &local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"ClearedImg","");
            local_278._0_8_ = &local_268;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_278,"Image after clearing, erroneously non-black","");
            pSVar6 = (Surface *)local_250;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,(string *)local_298,(string *)local_278,pSVar6,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1d8,iVar9,__buf_01,(size_t)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_p != local_1a8) {
              operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
            }
            if ((TestLog *)local_1d8._0_8_ != (TestLog *)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ != &local_288) {
              operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
            }
            tcu::TestContext::setTestResult
                      (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,
                       QP_TEST_RESULT_FAIL,"Failed");
            tcu::Surface::~Surface((Surface *)local_250);
            goto LAB_003734a8;
          }
          uVar8 = uVar8 + 1;
        } while (((ulong)local_250 & 0xffffffff) != uVar8);
      }
      fVar10 = (float)((int)fVar10 + 1);
      lVar7 = lVar7 + ((ulong)local_250 & 0xffffffff);
    } while (fVar10 != (float)local_250._4_4_);
  }
  tcu::Surface::~Surface((Surface *)local_250);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first"
             ,0x96);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  local_210.m_data[0] = 1.0;
  local_210.m_data[1] = -1.0;
  local_218.m_data[0] = -1.0;
  local_218.m_data[1] = 1.0;
  local_220.m_data[0] = 1.0;
  local_220.m_data[1] = 1.0;
  local_1d8._0_8_ = (TestLog *)0x3f8000003f800000;
  local_1d8._8_8_ = 0x3f8000003f800000;
  local_298._0_8_ = (pointer)0xbf800000bf800000;
  local_298._8_4_ = 0.0;
  local_278._0_8_ = (pointer)0xbf8000003f800000;
  local_278._8_4_ = 0.0;
  local_250 = (undefined1  [8])0x3f800000bf800000;
  local_248 = 0.0;
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,(Vec3 *)local_298,(Vec3 *)local_278,(Vec3 *)local_250,
             (Vec4 *)local_1d8,(Vec4 *)local_1d8,(Vec4 *)local_1d8);
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,&local_218,&local_210,&local_220,(Vec4 *)local_1d8,
             (Vec4 *)local_1d8,(Vec4 *)local_1d8);
  MultisampleCase::readImage(&this->super_MultisampleCase,&local_208);
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"RenderedImgSecond","");
  local_278._0_8_ = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Second image rendered","");
  pSVar6 = &local_208;
  tcu::LogImage::LogImage
            ((LogImage *)local_1d8,(string *)local_298,(string *)local_278,pSVar6,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1d8,iVar9,__buf_00,(size_t)pSVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1d8._0_8_ != (TestLog *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ != &local_268) {
    operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffff00000000;
  bVar3 = tcu::pixelThresholdCompare
                    (log,"ImageCompare","Image comparison",&local_1f0,&local_208,(RGBA *)local_1d8,
                     COMPARE_LOG_ON_ERROR);
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1d8 + 8);
    local_1d8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Success: The two images rendered are identical",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
    description = "Passed";
  }
  else {
    description = "Failed";
  }
  tcu::TestContext::setTestResult
            (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,(uint)!bVar3,
             description);
LAB_003734a8:
  tcu::Surface::~Surface(&local_208);
  tcu::Surface::~Surface(&local_1f0);
  return STOP;
}

Assistant:

SampleStencilCase::IterateResult SampleStencilCase::iterate (void)
{
	TestLog&		log					= m_testCtx.getLog();
	tcu::Surface	renderedImgFirst	(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSecond	(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClearStencil(0));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_STENCIL_TEST));
	GLU_CHECK_CALL(glStencilFunc(GL_ALWAYS, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE));

	log << TestLog::Message << "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)" << TestLog::EndMessage;

	{
		const int numTriangles = 25;
		for (int i = 0; i < numTriangles; i++)
		{
			float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
			float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

			renderTriangle(Vec2(0.0f, 0.0f),
						   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
						   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
						   Vec4(1.0f));
		}
	}

	readImage(renderedImgFirst);
	log << TestLog::Image("RenderedImgFirst", "First image rendered", renderedImgFirst, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color buffer to black" << TestLog::EndMessage;

	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glStencilFunc(GL_EQUAL, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP));

	{
		log << TestLog::Message << "Checking that color buffer was actually cleared to black" << TestLog::EndMessage;

		tcu::Surface clearedImg(m_viewportSize, m_viewportSize);
		readImage(clearedImg);

		for (int y = 0; y < clearedImg.getHeight(); y++)
		for (int x = 0; x < clearedImg.getWidth(); x++)
		{
			const tcu::RGBA& clr = clearedImg.getPixel(x, y);
			if (clr != tcu::RGBA::black())
			{
				log << TestLog::Message << "Failure: first non-black pixel, color " << clr << ", detected at coordinates (" << x << ", " << y << ")" << TestLog::EndMessage;
				log << TestLog::Image("ClearedImg", "Image after clearing, erroneously non-black", clearedImg);
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
				return STOP;
			}
		}
	}

	log << TestLog::Message << "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first" << TestLog::EndMessage;

	renderQuad(Vec2(-1.0f, -1.0f),
			   Vec2( 1.0f, -1.0f),
			   Vec2(-1.0f,  1.0f),
			   Vec2( 1.0f,  1.0f),
			   Vec4(1.0f));

	readImage(renderedImgSecond);
	log << TestLog::Image("RenderedImgSecond", "Second image rendered", renderedImgSecond, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "ImageCompare",
											 "Image comparison",
											 renderedImgFirst,
											 renderedImgSecond,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}